

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptm_mgau.c
# Opt level: O0

int ptm_mgau_frame_eval(ps_mgau_t *ps,int16 *senone_scores,uint8 *senone_active,
                       int32 n_senone_active,mfcc_t **featbuf,int32 frame,int32 compallsen)

{
  char **ppcVar1;
  int iVar2;
  undefined8 *local_50;
  ptm_fast_eval_t *lastf;
  int fast_eval_idx;
  ptm_mgau_t *s;
  int32 frame_local;
  mfcc_t **featbuf_local;
  int32 n_senone_active_local;
  uint8 *senone_active_local;
  int16 *senone_scores_local;
  ps_mgau_t *ps_local;
  
  iVar2 = frame % *(int *)&ps[6].vt;
  *(char ***)&ps[5].frame_idx = &(ps[5].vt)->name + (long)iVar2 * 2;
  if (ps->frame_idx <= frame) {
    if (iVar2 == 0) {
      ppcVar1 = &(ps[5].vt)->name + (long)*(int *)&ps[6].vt * 2;
    }
    else {
      ppcVar1 = &(ps[5].vt)->name + (long)iVar2 * 2;
    }
    local_50 = ppcVar1 + -2;
    memcpy((void *)**(undefined8 **)**(undefined8 **)&ps[5].frame_idx,
           (void *)**(undefined8 **)*local_50,
           (long)(*(int *)(*(long *)&ps[1].frame_idx + 0x20) *
                  *(int *)(*(long *)&ps[1].frame_idx + 0x24) * (int)(short)ps[4].frame_idx) << 3);
    ptm_mgau_calc_cb_active((ptm_mgau_t *)ps,senone_active,n_senone_active,compallsen);
    ptm_mgau_codebook_eval((ptm_mgau_t *)ps,featbuf,frame);
    ptm_mgau_codebook_norm((ptm_mgau_t *)ps,featbuf,frame);
  }
  ptm_mgau_senone_eval((ptm_mgau_t *)ps,senone_scores,senone_active,n_senone_active,compallsen);
  return 0;
}

Assistant:

int32
ptm_mgau_frame_eval(ps_mgau_t *ps,
                    int16 *senone_scores,
                    uint8 *senone_active,
                    int32 n_senone_active,
                    mfcc_t ** featbuf, int32 frame,
                    int32 compallsen)
{
    ptm_mgau_t *s = (ptm_mgau_t *)ps;
    int fast_eval_idx;

    /* Find the appropriate frame in the rotating history buffer
     * corresponding to the requested input frame.  No bounds checking
     * is done here, which just means you'll get semi-random crap if
     * you request a frame in the future or one that's too far in the
     * past.  Since the history buffer is just used for fast match
     * that might not be fatal. */
    fast_eval_idx = frame % s->n_fast_hist;
    s->f = s->hist + fast_eval_idx;
    /* Compute the top-N codewords for every codebook, unless this
     * is a past frame, in which case we already have them (we
     * hope!) */
    if (frame >= ps_mgau_base(ps)->frame_idx) {
        ptm_fast_eval_t *lastf;
        /* Get the previous frame's top-N information (on the
         * first frame of the input this is just all WORST_DIST,
         * no harm in that) */
        if (fast_eval_idx == 0)
            lastf = s->hist + s->n_fast_hist - 1;
        else
            lastf = s->hist + fast_eval_idx - 1;
        /* Copy in initial top-N info */
        memcpy(s->f->topn[0][0], lastf->topn[0][0],
               s->g->n_mgau * s->g->n_feat * s->max_topn * sizeof(ptm_topn_t));
        /* Generate initial active codebook list (this might not be
         * necessary) */
        ptm_mgau_calc_cb_active(s, senone_active, n_senone_active, compallsen);
        /* Now evaluate top-N, prune, and evaluate remaining codebooks. */
        ptm_mgau_codebook_eval(s, featbuf, frame);
        ptm_mgau_codebook_norm(s, featbuf, frame);
    }
    /* Evaluate intersection of active senones and active codebooks. */
    ptm_mgau_senone_eval(s, senone_scores, senone_active,
                         n_senone_active, compallsen);

    return 0;
}